

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  __m128 _w3_2;
  __m128 _w2_2;
  __m128 _w1_2;
  __m128 _w0_2;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int q_5;
  __m128 _sum;
  float *kptr0_2;
  float *tmpptr_5;
  __m128 _w3_1;
  __m128 _w2_1;
  __m128 _w1_1;
  __m128 _w0_1;
  __m128 _val13_1;
  __m128 _val12_1;
  __m128 _val11_1;
  __m128 _val10_1;
  __m128 _val03_1;
  __m128 _val02_1;
  __m128 _val01_1;
  __m128 _val00_1;
  int q_4;
  __m128 _sum1_1;
  __m128 _sum0_1;
  float *kptr0_1;
  float *tmpptr_4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val33;
  __m128 _val32;
  __m128 _val31;
  __m128 _val30;
  __m128 _val23;
  __m128 _val22;
  __m128 _val21;
  __m128 _val20;
  __m128 _val13;
  __m128 _val12;
  __m128 _val11;
  __m128 _val10;
  __m128 _val03;
  __m128 _val02;
  __m128 _val01;
  __m128 _val00;
  int q_3;
  __m128 _sum3;
  __m128 _sum2;
  __m128 _sum1;
  __m128 _sum0;
  float *kptr0;
  float *tmpptr_3;
  int i_3;
  float *biasptr;
  float zeros [4];
  float *outptr0;
  int p;
  __m128 _r0_2;
  int q_2;
  float *tmpptr_2;
  float *img0_2;
  int i_2;
  __m128 _r1_1;
  __m128 _r0_1;
  int q_1;
  float *tmpptr_1;
  float *img0_1;
  int i_1;
  int ii_1;
  __m128 _r3;
  __m128 _r2;
  __m128 _r1;
  __m128 _r0;
  int q;
  float *tmpptr;
  float *img0;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int size;
  int elempack;
  size_t elemsize;
  int outch;
  int inch;
  int h;
  int w;
  int in_stack_ffffffffffffe044;
  undefined4 in_stack_ffffffffffffe048;
  undefined4 in_stack_ffffffffffffe04c;
  int in_stack_ffffffffffffe054;
  int in_stack_ffffffffffffe058;
  int in_stack_ffffffffffffe05c;
  undefined4 in_stack_ffffffffffffe060;
  float in_stack_ffffffffffffe064;
  float in_stack_ffffffffffffe068;
  float in_stack_ffffffffffffe06c;
  undefined4 in_stack_ffffffffffffe070;
  undefined4 in_stack_ffffffffffffe074;
  float *local_1b40;
  int local_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  Mat local_1a58;
  float *local_1a10;
  Mat local_1a08;
  float *local_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  int local_18ec;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  Mat local_18c8;
  float *local_1880;
  Mat local_1878;
  float *local_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  int local_16dc;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  Mat local_1698;
  float *local_1650;
  Mat local_1648;
  float *local_1600;
  int local_15f4;
  float *local_15f0;
  float local_15e8 [6];
  Mat local_15d0;
  float *local_1588;
  int local_157c;
  undefined8 local_1578;
  undefined8 uStack_1570;
  int local_1564;
  Mat local_1560;
  float *local_1518;
  Mat local_1510;
  float *local_14c8;
  int local_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  int local_1494;
  Mat local_1490;
  float *local_1448;
  Mat local_1440;
  float *local_13f8;
  int local_13f0;
  int local_13ec;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  int local_13a4;
  Mat local_13a0;
  float *local_1358;
  Mat local_1340;
  float *local_12f8;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  float *local_1298;
  int local_1290;
  undefined4 local_128c;
  undefined8 local_1288;
  int local_1280;
  int local_127c;
  int local_1278;
  int local_1274;
  long local_1250;
  float *local_1248;
  float *local_1240;
  float *local_1238;
  float *local_1230;
  float *local_1228;
  float *local_1220;
  float *local_1218;
  float *local_1210;
  float *local_1208;
  float *local_1200;
  float *local_11f8;
  float *local_11f0;
  float *local_11e8;
  float *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  float *local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  float *local_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  float *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  float *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  float *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined8 local_b98;
  undefined8 uStack_b90;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined8 local_a18;
  undefined8 uStack_a10;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined1 local_9c8 [16];
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined8 local_918;
  undefined8 uStack_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a4;
  float *local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_484;
  float *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_464;
  float *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_444;
  float *local_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_424;
  float *local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_404;
  float *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e4;
  float *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c4;
  float *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a4;
  float *local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_384;
  float *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_364;
  float *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_344;
  float *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_324;
  float *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_304;
  float *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e4;
  float *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c4;
  float *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a4;
  float *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_284;
  float *local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_264;
  float *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_244;
  float *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_224;
  float *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_204;
  float *local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e4;
  float *local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c4;
  float *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a4;
  float *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_184;
  float *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_164;
  float *local_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_144;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_1274 = *(int *)(in_RDI + 0x2c);
  local_1278 = *(int *)(in_RDI + 0x30);
  local_127c = *(int *)(in_RDI + 0x38);
  local_1280 = *(int *)(in_RSI + 0x38);
  local_1288 = *(undefined8 *)(in_RDI + 0x10);
  local_128c = *(undefined4 *)(in_RDI + 0x18);
  local_1290 = local_1274 * local_1278;
  local_1250 = in_RDI;
  local_1298 = Mat::operator_cast_to_float_(in_RCX);
  Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffffe064,in_stack_ffffffffffffe060),
           in_stack_ffffffffffffe05c,in_stack_ffffffffffffe058,in_stack_ffffffffffffe054,
           CONCAT44(in_stack_ffffffffffffe04c,in_stack_ffffffffffffe048),in_stack_ffffffffffffe044,
           (Allocator *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070));
  local_12e8 = 0;
  local_12e4 = local_1290 >> 2;
  for (local_12ec = 0; local_12ec < local_12e4; local_12ec = local_12ec + 1) {
    local_12f0 = local_12e8 + local_12ec * 4;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_1340);
    Mat::~Mat((Mat *)0x3313e9);
    local_12f8 = pfVar9 + (local_12f0 << 2);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_13a0);
    Mat::~Mat((Mat *)0x331469);
    local_1358 = pfVar9;
    for (local_13a4 = 0; local_13a4 < local_127c; local_13a4 = local_13a4 + 1) {
      local_11e0 = local_12f8;
      local_13b8 = *(undefined8 *)local_12f8;
      uStack_13b0 = *(undefined8 *)(local_12f8 + 2);
      local_11e8 = local_12f8 + 4;
      local_13c8 = *(undefined8 *)local_11e8;
      uStack_13c0 = *(undefined8 *)(local_12f8 + 6);
      local_11f0 = local_12f8 + 8;
      local_13d8 = *(undefined8 *)local_11f0;
      uStack_13d0 = *(undefined8 *)(local_12f8 + 10);
      local_11f8 = local_12f8 + 0xc;
      local_13e8 = *(undefined8 *)local_11f8;
      uStack_13e0 = *(undefined8 *)(local_12f8 + 0xe);
      local_bc0 = local_1358;
      *(undefined8 *)local_1358 = local_13b8;
      *(undefined8 *)(local_1358 + 2) = uStack_13b0;
      local_be0 = local_1358 + 4;
      *(undefined8 *)local_be0 = local_13c8;
      *(undefined8 *)(local_1358 + 6) = uStack_13c0;
      local_c00 = local_1358 + 8;
      *(undefined8 *)local_c00 = local_13d8;
      *(undefined8 *)(local_1358 + 10) = uStack_13d0;
      local_c20 = local_1358 + 0xc;
      *(undefined8 *)local_c20 = local_13e8;
      *(undefined8 *)(local_1358 + 0xe) = uStack_13e0;
      local_1358 = local_1358 + 0x10;
      local_12f8 = local_12f8 + *(long *)(local_1250 + 0x40) * 4;
      local_c38 = local_13e8;
      uStack_c30 = uStack_13e0;
      local_c18 = local_13d8;
      uStack_c10 = uStack_13d0;
      local_bf8 = local_13c8;
      uStack_bf0 = uStack_13c0;
      local_bd8 = local_13b8;
      uStack_bd0 = uStack_13b0;
    }
  }
  local_12e8 = local_12e4 * 4 + local_12e8;
  local_12e4 = local_1290 - local_12e8 >> 1;
  for (local_13ec = 0; local_13ec < local_12e4; local_13ec = local_13ec + 1) {
    local_13f0 = local_12e8 + local_13ec * 2;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_1440);
    Mat::~Mat((Mat *)0x331792);
    local_13f8 = pfVar9 + (local_13f0 << 2);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_1490);
    Mat::~Mat((Mat *)0x331826);
    local_1448 = pfVar9;
    for (local_1494 = 0; local_1494 < local_127c; local_1494 = local_1494 + 1) {
      local_1200 = local_13f8;
      local_14a8 = *(undefined8 *)local_13f8;
      uStack_14a0 = *(undefined8 *)(local_13f8 + 2);
      local_1208 = local_13f8 + 4;
      local_14b8 = *(undefined8 *)local_1208;
      uStack_14b0 = *(undefined8 *)(local_13f8 + 6);
      local_c40 = local_1448;
      *(undefined8 *)local_1448 = local_14a8;
      *(undefined8 *)(local_1448 + 2) = uStack_14a0;
      local_c60 = local_1448 + 4;
      *(undefined8 *)local_c60 = local_14b8;
      *(undefined8 *)(local_1448 + 6) = uStack_14b0;
      local_1448 = local_1448 + 8;
      local_13f8 = local_13f8 + *(long *)(local_1250 + 0x40) * 4;
      local_c78 = local_14b8;
      uStack_c70 = uStack_14b0;
      local_c58 = local_14a8;
      uStack_c50 = uStack_14a0;
    }
  }
  local_14bc = local_12e4 * 2 + local_12e8;
  local_12e8 = local_14bc;
  for (; local_14bc < local_1290; local_14bc = local_14bc + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_1510);
    Mat::~Mat((Mat *)0x331a3d);
    local_14c8 = pfVar9 + (local_14bc << 2);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_1560);
    Mat::~Mat((Mat *)0x331ae3);
    local_1518 = pfVar9;
    for (local_1564 = 0; local_1564 < local_127c; local_1564 = local_1564 + 1) {
      local_1210 = local_14c8;
      local_1578 = *(undefined8 *)local_14c8;
      uStack_1570 = *(undefined8 *)(local_14c8 + 2);
      local_c80 = local_1518;
      *(undefined8 *)local_1518 = local_1578;
      *(undefined8 *)(local_1518 + 2) = uStack_1570;
      local_1518 = local_1518 + 4;
      local_14c8 = local_14c8 + *(long *)(local_1250 + 0x40) * 4;
      local_c98 = local_1578;
      uStack_c90 = uStack_1570;
    }
  }
  for (local_157c = 0; local_157c < local_1280; local_157c = local_157c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                 (int)in_stack_ffffffffffffe064);
    pfVar9 = Mat::operator_cast_to_float_(&local_15d0);
    Mat::~Mat((Mat *)0x331c81);
    local_1588 = pfVar9;
    memset(local_15e8,0,0x10);
    if (local_1298 == (float *)0x0) {
      local_1b40 = local_15e8;
    }
    else {
      local_1b40 = local_1298 + (local_157c << 2);
    }
    local_15f0 = local_1b40;
    for (local_15f4 = 0; local_15f4 + 3 < local_1290; local_15f4 = local_15f4 + 4) {
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_1648);
      Mat::~Mat((Mat *)0x331d67);
      local_1600 = pfVar9;
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_1698);
      Mat::~Mat((Mat *)0x331db9);
      local_1218 = local_15f0;
      local_16a8 = *(undefined8 *)local_15f0;
      uStack_16a0 = *(undefined8 *)(local_15f0 + 2);
      local_1220 = local_15f0;
      local_16b8 = *(undefined8 *)local_15f0;
      uStack_16b0 = *(undefined8 *)(local_15f0 + 2);
      local_1228 = local_15f0;
      local_16c8 = *(undefined8 *)local_15f0;
      uStack_16c0 = *(undefined8 *)(local_15f0 + 2);
      local_1230 = local_15f0;
      local_16d8 = *(undefined8 *)local_15f0;
      uStack_16d0 = *(undefined8 *)(local_15f0 + 2);
      local_1650 = pfVar9;
      for (local_16dc = 0; local_16dc < local_127c; local_16dc = local_16dc + 1) {
        local_140 = local_1600;
        local_158 = *local_1600;
        local_16f8 = CONCAT44(local_158,local_158);
        uStack_16f0 = CONCAT44(local_158,local_158);
        local_160 = local_1600 + 1;
        local_178 = *local_160;
        local_1708 = CONCAT44(local_178,local_178);
        uStack_1700 = CONCAT44(local_178,local_178);
        local_180 = local_1600 + 2;
        local_198 = *local_180;
        local_1718 = CONCAT44(local_198,local_198);
        uStack_1710 = CONCAT44(local_198,local_198);
        local_1a0 = local_1600 + 3;
        local_1b8 = *local_1a0;
        local_1728 = CONCAT44(local_1b8,local_1b8);
        uStack_1720 = CONCAT44(local_1b8,local_1b8);
        local_1c0 = local_1600 + 4;
        local_1d8 = *local_1c0;
        local_1738 = CONCAT44(local_1d8,local_1d8);
        uStack_1730 = CONCAT44(local_1d8,local_1d8);
        local_1e0 = local_1600 + 5;
        local_1f8 = *local_1e0;
        local_1748 = CONCAT44(local_1f8,local_1f8);
        uStack_1740 = CONCAT44(local_1f8,local_1f8);
        local_200 = local_1600 + 6;
        local_218 = *local_200;
        local_1758 = CONCAT44(local_218,local_218);
        uStack_1750 = CONCAT44(local_218,local_218);
        local_220 = local_1600 + 7;
        local_238 = *local_220;
        local_1768 = CONCAT44(local_238,local_238);
        uStack_1760 = CONCAT44(local_238,local_238);
        local_240 = local_1600 + 8;
        local_258 = *local_240;
        local_1778 = CONCAT44(local_258,local_258);
        uStack_1770 = CONCAT44(local_258,local_258);
        local_260 = local_1600 + 9;
        local_278 = *local_260;
        local_1788 = CONCAT44(local_278,local_278);
        uStack_1780 = CONCAT44(local_278,local_278);
        local_280 = local_1600 + 10;
        local_298 = *local_280;
        local_1798 = CONCAT44(local_298,local_298);
        uStack_1790 = CONCAT44(local_298,local_298);
        local_2a0 = local_1600 + 0xb;
        local_2b8 = *local_2a0;
        local_17a8 = CONCAT44(local_2b8,local_2b8);
        uStack_17a0 = CONCAT44(local_2b8,local_2b8);
        local_2c0 = local_1600 + 0xc;
        local_2d8 = *local_2c0;
        local_17b8 = CONCAT44(local_2d8,local_2d8);
        uStack_17b0 = CONCAT44(local_2d8,local_2d8);
        local_2e0 = local_1600 + 0xd;
        local_2f8 = *local_2e0;
        local_17c8 = CONCAT44(local_2f8,local_2f8);
        uStack_17c0 = CONCAT44(local_2f8,local_2f8);
        local_300 = local_1600 + 0xe;
        local_318 = *local_300;
        local_17d8 = CONCAT44(local_318,local_318);
        uStack_17d0 = CONCAT44(local_318,local_318);
        local_320 = local_1600 + 0xf;
        local_338 = *local_320;
        local_17e8 = CONCAT44(local_338,local_338);
        uStack_17e0 = CONCAT44(local_338,local_338);
        local_e0 = local_1650;
        local_17f8 = *(undefined8 *)local_1650;
        uStack_17f0 = *(undefined8 *)(local_1650 + 2);
        local_e8 = local_1650 + 4;
        local_1808 = *(undefined8 *)local_e8;
        uStack_1800 = *(undefined8 *)(local_1650 + 6);
        local_f0 = local_1650 + 8;
        local_1818 = *(undefined8 *)local_f0;
        uStack_1810 = *(undefined8 *)(local_1650 + 10);
        local_f8 = local_1650 + 0xc;
        local_1828 = *(undefined8 *)local_f8;
        uStack_1820 = *(undefined8 *)(local_1650 + 0xe);
        local_cc8 = local_16a8;
        uStack_cc0 = uStack_16a0;
        local_828._0_4_ = (float)local_17f8;
        local_828._4_4_ = (float)((ulong)local_17f8 >> 0x20);
        uStack_820._0_4_ = (float)uStack_17f0;
        uStack_820._4_4_ = (float)((ulong)uStack_17f0 >> 0x20);
        local_ba8 = (float)local_828 * local_158;
        fStack_ba4 = local_828._4_4_ * local_158;
        fStack_ba0 = (float)uStack_820 * local_158;
        fStack_b9c = uStack_820._4_4_ * local_158;
        uVar1 = local_16a8;
        uVar2 = uStack_16a0;
        local_bb8._0_4_ = (float)local_16a8;
        local_bb8._4_4_ = (float)((ulong)local_16a8 >> 0x20);
        uStack_bb0._0_4_ = (float)uStack_16a0;
        uStack_bb0._4_4_ = (float)((ulong)uStack_16a0 >> 0x20);
        local_cf8 = CONCAT44(fStack_ba4 + local_bb8._4_4_,local_ba8 + (float)local_bb8);
        uStack_cf0 = CONCAT44(fStack_b9c + uStack_bb0._4_4_,fStack_ba0 + (float)uStack_bb0);
        local_808._0_4_ = (float)local_1808;
        local_808._4_4_ = (float)((ulong)local_1808 >> 0x20);
        uStack_800._0_4_ = (float)uStack_1800;
        uStack_800._4_4_ = (float)((ulong)uStack_1800 >> 0x20);
        local_b88 = (float)local_808 * local_178;
        fStack_b84 = local_808._4_4_ * local_178;
        fStack_b80 = (float)uStack_800 * local_178;
        fStack_b7c = uStack_800._4_4_ * local_178;
        fVar10 = local_b88 + local_ba8 + (float)local_bb8;
        fVar11 = fStack_b84 + fStack_ba4 + local_bb8._4_4_;
        fVar12 = fStack_b80 + fStack_ba0 + (float)uStack_bb0;
        fVar13 = fStack_b7c + fStack_b9c + uStack_bb0._4_4_;
        local_d28 = CONCAT44(fVar11,fVar10);
        uStack_d20 = CONCAT44(fVar13,fVar12);
        local_7e8._0_4_ = (float)local_1818;
        local_7e8._4_4_ = (float)((ulong)local_1818 >> 0x20);
        uStack_7e0._0_4_ = (float)uStack_1810;
        uStack_7e0._4_4_ = (float)((ulong)uStack_1810 >> 0x20);
        local_b68 = (float)local_7e8 * local_198;
        fStack_b64 = local_7e8._4_4_ * local_198;
        fStack_b60 = (float)uStack_7e0 * local_198;
        fStack_b5c = uStack_7e0._4_4_ * local_198;
        fVar10 = local_b68 + fVar10;
        fVar11 = fStack_b64 + fVar11;
        fVar12 = fStack_b60 + fVar12;
        fVar13 = fStack_b5c + fVar13;
        local_d58 = CONCAT44(fVar11,fVar10);
        uStack_d50 = CONCAT44(fVar13,fVar12);
        local_7c8._0_4_ = (float)local_1828;
        local_7c8._4_4_ = (float)((ulong)local_1828 >> 0x20);
        uStack_7c0._0_4_ = (float)uStack_1820;
        uStack_7c0._4_4_ = (float)((ulong)uStack_1820 >> 0x20);
        local_b48 = (float)local_7c8 * local_1b8;
        fStack_b44 = local_7c8._4_4_ * local_1b8;
        fStack_b40 = (float)uStack_7c0 * local_1b8;
        fStack_b3c = uStack_7c0._4_4_ * local_1b8;
        local_16a8 = CONCAT44(fStack_b44 + fVar11,local_b48 + fVar10);
        uStack_16a0 = CONCAT44(fStack_b3c + fVar13,fStack_b40 + fVar12);
        local_d88 = local_16b8;
        uStack_d80 = uStack_16b0;
        local_b28 = (float)local_828 * local_1d8;
        fStack_b24 = local_828._4_4_ * local_1d8;
        fStack_b20 = (float)uStack_820 * local_1d8;
        fStack_b1c = uStack_820._4_4_ * local_1d8;
        uVar3 = local_16b8;
        uVar4 = uStack_16b0;
        local_b38._0_4_ = (float)local_16b8;
        local_b38._4_4_ = (float)((ulong)local_16b8 >> 0x20);
        uStack_b30._0_4_ = (float)uStack_16b0;
        uStack_b30._4_4_ = (float)((ulong)uStack_16b0 >> 0x20);
        local_db8 = CONCAT44(fStack_b24 + local_b38._4_4_,local_b28 + (float)local_b38);
        uStack_db0 = CONCAT44(fStack_b1c + uStack_b30._4_4_,fStack_b20 + (float)uStack_b30);
        local_b08 = (float)local_808 * local_1f8;
        fStack_b04 = local_808._4_4_ * local_1f8;
        fStack_b00 = (float)uStack_800 * local_1f8;
        fStack_afc = uStack_800._4_4_ * local_1f8;
        fVar10 = local_b08 + local_b28 + (float)local_b38;
        fVar11 = fStack_b04 + fStack_b24 + local_b38._4_4_;
        fVar12 = fStack_b00 + fStack_b20 + (float)uStack_b30;
        fVar13 = fStack_afc + fStack_b1c + uStack_b30._4_4_;
        local_de8 = CONCAT44(fVar11,fVar10);
        uStack_de0 = CONCAT44(fVar13,fVar12);
        local_ae8 = (float)local_7e8 * local_218;
        fStack_ae4 = local_7e8._4_4_ * local_218;
        fStack_ae0 = (float)uStack_7e0 * local_218;
        fStack_adc = uStack_7e0._4_4_ * local_218;
        fVar10 = local_ae8 + fVar10;
        fVar11 = fStack_ae4 + fVar11;
        fVar12 = fStack_ae0 + fVar12;
        fVar13 = fStack_adc + fVar13;
        local_e18 = CONCAT44(fVar11,fVar10);
        uStack_e10 = CONCAT44(fVar13,fVar12);
        local_ac8 = (float)local_7c8 * local_238;
        fStack_ac4 = local_7c8._4_4_ * local_238;
        fStack_ac0 = (float)uStack_7c0 * local_238;
        fStack_abc = uStack_7c0._4_4_ * local_238;
        local_16b8 = CONCAT44(fStack_ac4 + fVar11,local_ac8 + fVar10);
        uStack_16b0 = CONCAT44(fStack_abc + fVar13,fStack_ac0 + fVar12);
        local_e48 = local_16c8;
        uStack_e40 = uStack_16c0;
        local_aa8 = (float)local_828 * local_258;
        fStack_aa4 = local_828._4_4_ * local_258;
        fStack_aa0 = (float)uStack_820 * local_258;
        fStack_a9c = uStack_820._4_4_ * local_258;
        uVar5 = local_16c8;
        uVar6 = uStack_16c0;
        local_ab8._0_4_ = (float)local_16c8;
        local_ab8._4_4_ = (float)((ulong)local_16c8 >> 0x20);
        uStack_ab0._0_4_ = (float)uStack_16c0;
        uStack_ab0._4_4_ = (float)((ulong)uStack_16c0 >> 0x20);
        local_e78 = CONCAT44(fStack_aa4 + local_ab8._4_4_,local_aa8 + (float)local_ab8);
        uStack_e70 = CONCAT44(fStack_a9c + uStack_ab0._4_4_,fStack_aa0 + (float)uStack_ab0);
        local_a88 = (float)local_808 * local_278;
        fStack_a84 = local_808._4_4_ * local_278;
        fStack_a80 = (float)uStack_800 * local_278;
        fStack_a7c = uStack_800._4_4_ * local_278;
        fVar10 = local_a88 + local_aa8 + (float)local_ab8;
        fVar11 = fStack_a84 + fStack_aa4 + local_ab8._4_4_;
        fVar12 = fStack_a80 + fStack_aa0 + (float)uStack_ab0;
        fVar13 = fStack_a7c + fStack_a9c + uStack_ab0._4_4_;
        local_ea8 = CONCAT44(fVar11,fVar10);
        uStack_ea0 = CONCAT44(fVar13,fVar12);
        local_a68 = (float)local_7e8 * local_298;
        fStack_a64 = local_7e8._4_4_ * local_298;
        fStack_a60 = (float)uStack_7e0 * local_298;
        fStack_a5c = uStack_7e0._4_4_ * local_298;
        fVar10 = local_a68 + fVar10;
        fVar11 = fStack_a64 + fVar11;
        fVar12 = fStack_a60 + fVar12;
        fVar13 = fStack_a5c + fVar13;
        local_ed8 = CONCAT44(fVar11,fVar10);
        uStack_ed0 = CONCAT44(fVar13,fVar12);
        local_a48 = (float)local_7c8 * local_2b8;
        fStack_a44 = local_7c8._4_4_ * local_2b8;
        fStack_a40 = (float)uStack_7c0 * local_2b8;
        fStack_a3c = uStack_7c0._4_4_ * local_2b8;
        local_16c8 = CONCAT44(fStack_a44 + fVar11,local_a48 + fVar10);
        uStack_16c0 = CONCAT44(fStack_a3c + fVar13,fStack_a40 + fVar12);
        local_f08 = local_16d8;
        uStack_f00 = uStack_16d0;
        local_a28 = (float)local_828 * local_2d8;
        fStack_a24 = local_828._4_4_ * local_2d8;
        fStack_a20 = (float)uStack_820 * local_2d8;
        fStack_a1c = uStack_820._4_4_ * local_2d8;
        uVar7 = local_16d8;
        uVar8 = uStack_16d0;
        local_a38._0_4_ = (float)local_16d8;
        local_a38._4_4_ = (float)((ulong)local_16d8 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_16d0;
        uStack_a30._4_4_ = (float)((ulong)uStack_16d0 >> 0x20);
        local_f38 = CONCAT44(fStack_a24 + local_a38._4_4_,local_a28 + (float)local_a38);
        uStack_f30 = CONCAT44(fStack_a1c + uStack_a30._4_4_,fStack_a20 + (float)uStack_a30);
        local_a08 = (float)local_808 * local_2f8;
        fStack_a04 = local_808._4_4_ * local_2f8;
        fStack_a00 = (float)uStack_800 * local_2f8;
        fStack_9fc = uStack_800._4_4_ * local_2f8;
        fVar10 = local_a08 + local_a28 + (float)local_a38;
        fVar11 = fStack_a04 + fStack_a24 + local_a38._4_4_;
        fVar12 = fStack_a00 + fStack_a20 + (float)uStack_a30;
        fVar13 = fStack_9fc + fStack_a1c + uStack_a30._4_4_;
        local_f68 = CONCAT44(fVar11,fVar10);
        uStack_f60 = CONCAT44(fVar13,fVar12);
        local_9e8 = (float)local_7e8 * local_318;
        fStack_9e4 = local_7e8._4_4_ * local_318;
        fStack_9e0 = (float)uStack_7e0 * local_318;
        fStack_9dc = uStack_7e0._4_4_ * local_318;
        fVar10 = local_9e8 + fVar10;
        fVar11 = fStack_9e4 + fVar11;
        fVar12 = fStack_9e0 + fVar12;
        fVar13 = fStack_9dc + fVar13;
        local_f98 = CONCAT44(fVar11,fVar10);
        uStack_f90 = CONCAT44(fVar13,fVar12);
        local_9c8._0_4_ = (float)local_7c8 * local_338;
        local_9c8._4_4_ = local_7c8._4_4_ * local_338;
        local_9c8._8_4_ = (float)uStack_7c0 * local_338;
        local_9c8._12_4_ = uStack_7c0._4_4_ * local_338;
        local_16d8 = CONCAT44(local_9c8._4_4_ + fVar11,local_9c8._0_4_ + fVar10);
        uStack_16d0 = CONCAT44(local_9c8._12_4_ + fVar13,local_9c8._8_4_ + fVar12);
        local_1600 = local_1600 + 0x10;
        local_1650 = local_1650 + 0x10;
        local_f88 = local_17e8;
        uStack_f80 = uStack_17e0;
        local_f78 = local_1828;
        uStack_f70 = uStack_1820;
        local_f58 = local_17d8;
        uStack_f50 = uStack_17d0;
        local_f48 = local_1818;
        uStack_f40 = uStack_1810;
        local_f28 = local_17c8;
        uStack_f20 = uStack_17c0;
        local_f18 = local_1808;
        uStack_f10 = uStack_1800;
        local_ef8 = local_17b8;
        uStack_ef0 = uStack_17b0;
        local_ee8 = local_17f8;
        uStack_ee0 = uStack_17f0;
        local_ec8 = local_17a8;
        uStack_ec0 = uStack_17a0;
        local_eb8 = local_1828;
        uStack_eb0 = uStack_1820;
        local_e98 = local_1798;
        uStack_e90 = uStack_1790;
        local_e88 = local_1818;
        uStack_e80 = uStack_1810;
        local_e68 = local_1788;
        uStack_e60 = uStack_1780;
        local_e58 = local_1808;
        uStack_e50 = uStack_1800;
        local_e38 = local_1778;
        uStack_e30 = uStack_1770;
        local_e28 = local_17f8;
        uStack_e20 = uStack_17f0;
        local_e08 = local_1768;
        uStack_e00 = uStack_1760;
        local_df8 = local_1828;
        uStack_df0 = uStack_1820;
        local_dd8 = local_1758;
        uStack_dd0 = uStack_1750;
        local_dc8 = local_1818;
        uStack_dc0 = uStack_1810;
        local_da8 = local_1748;
        uStack_da0 = uStack_1740;
        local_d98 = local_1808;
        uStack_d90 = uStack_1800;
        local_d78 = local_1738;
        uStack_d70 = uStack_1730;
        local_d68 = local_17f8;
        uStack_d60 = uStack_17f0;
        local_d48 = local_1728;
        uStack_d40 = uStack_1720;
        local_d38 = local_1828;
        uStack_d30 = uStack_1820;
        local_d18 = local_1718;
        uStack_d10 = uStack_1710;
        local_d08 = local_1818;
        uStack_d00 = uStack_1810;
        local_ce8 = local_1708;
        uStack_ce0 = uStack_1700;
        local_cd8 = local_1808;
        uStack_cd0 = uStack_1800;
        local_cb8 = local_16f8;
        uStack_cb0 = uStack_16f0;
        local_ca8 = local_17f8;
        uStack_ca0 = uStack_17f0;
        local_bb8 = uVar1;
        uStack_bb0 = uVar2;
        local_b98 = local_cf8;
        uStack_b90 = uStack_cf0;
        local_b78 = local_d28;
        uStack_b70 = uStack_d20;
        local_b58 = local_d58;
        uStack_b50 = uStack_d50;
        local_b38 = uVar3;
        uStack_b30 = uVar4;
        local_b18 = local_db8;
        uStack_b10 = uStack_db0;
        local_af8 = local_de8;
        uStack_af0 = uStack_de0;
        local_ad8 = local_e18;
        uStack_ad0 = uStack_e10;
        local_ab8 = uVar5;
        uStack_ab0 = uVar6;
        local_a98 = local_e78;
        uStack_a90 = uStack_e70;
        local_a78 = local_ea8;
        uStack_a70 = uStack_ea0;
        local_a58 = local_ed8;
        uStack_a50 = uStack_ed0;
        local_a38 = uVar7;
        uStack_a30 = uVar8;
        local_a18 = local_f38;
        uStack_a10 = uStack_f30;
        local_9f8 = local_f68;
        uStack_9f0 = uStack_f60;
        local_9d8 = local_f98;
        uStack_9d0 = uStack_f90;
        local_838 = local_16f8;
        uStack_830 = uStack_16f0;
        local_828 = local_17f8;
        uStack_820 = uStack_17f0;
        local_818 = local_1708;
        uStack_810 = uStack_1700;
        local_808 = local_1808;
        uStack_800 = uStack_1800;
        local_7f8 = local_1718;
        uStack_7f0 = uStack_1710;
        local_7e8 = local_1818;
        uStack_7e0 = uStack_1810;
        local_7d8 = local_1728;
        uStack_7d0 = uStack_1720;
        local_7c8 = local_1828;
        uStack_7c0 = uStack_1820;
        local_7b8 = local_1738;
        uStack_7b0 = uStack_1730;
        local_7a8 = local_17f8;
        uStack_7a0 = uStack_17f0;
        local_798 = local_1748;
        uStack_790 = uStack_1740;
        local_788 = local_1808;
        uStack_780 = uStack_1800;
        local_778 = local_1758;
        uStack_770 = uStack_1750;
        local_768 = local_1818;
        uStack_760 = uStack_1810;
        local_758 = local_1768;
        uStack_750 = uStack_1760;
        local_748 = local_1828;
        uStack_740 = uStack_1820;
        local_738 = local_1778;
        uStack_730 = uStack_1770;
        local_728 = local_17f8;
        uStack_720 = uStack_17f0;
        local_718 = local_1788;
        uStack_710 = uStack_1780;
        local_708 = local_1808;
        uStack_700 = uStack_1800;
        local_6f8 = local_1798;
        uStack_6f0 = uStack_1790;
        local_6e8 = local_1818;
        uStack_6e0 = uStack_1810;
        local_6d8 = local_17a8;
        uStack_6d0 = uStack_17a0;
        local_6c8 = local_1828;
        uStack_6c0 = uStack_1820;
        local_6b8 = local_17b8;
        uStack_6b0 = uStack_17b0;
        local_6a8 = local_17f8;
        uStack_6a0 = uStack_17f0;
        local_698 = local_17c8;
        uStack_690 = uStack_17c0;
        local_688 = local_1808;
        uStack_680 = uStack_1800;
        local_678 = local_17d8;
        uStack_670 = uStack_17d0;
        local_668 = local_1818;
        uStack_660 = uStack_1810;
        local_658 = local_17e8;
        uStack_650 = uStack_17e0;
        local_648 = local_1828;
        uStack_640 = uStack_1820;
        fStack_334 = local_338;
        fStack_330 = local_338;
        fStack_32c = local_338;
        local_324 = local_338;
        fStack_314 = local_318;
        fStack_310 = local_318;
        fStack_30c = local_318;
        local_304 = local_318;
        fStack_2f4 = local_2f8;
        fStack_2f0 = local_2f8;
        fStack_2ec = local_2f8;
        local_2e4 = local_2f8;
        fStack_2d4 = local_2d8;
        fStack_2d0 = local_2d8;
        fStack_2cc = local_2d8;
        local_2c4 = local_2d8;
        fStack_2b4 = local_2b8;
        fStack_2b0 = local_2b8;
        fStack_2ac = local_2b8;
        local_2a4 = local_2b8;
        fStack_294 = local_298;
        fStack_290 = local_298;
        fStack_28c = local_298;
        local_284 = local_298;
        fStack_274 = local_278;
        fStack_270 = local_278;
        fStack_26c = local_278;
        local_264 = local_278;
        fStack_254 = local_258;
        fStack_250 = local_258;
        fStack_24c = local_258;
        local_244 = local_258;
        fStack_234 = local_238;
        fStack_230 = local_238;
        fStack_22c = local_238;
        local_224 = local_238;
        fStack_214 = local_218;
        fStack_210 = local_218;
        fStack_20c = local_218;
        local_204 = local_218;
        fStack_1f4 = local_1f8;
        fStack_1f0 = local_1f8;
        fStack_1ec = local_1f8;
        local_1e4 = local_1f8;
        fStack_1d4 = local_1d8;
        fStack_1d0 = local_1d8;
        fStack_1cc = local_1d8;
        local_1c4 = local_1d8;
        fStack_1b4 = local_1b8;
        fStack_1b0 = local_1b8;
        fStack_1ac = local_1b8;
        local_1a4 = local_1b8;
        fStack_194 = local_198;
        fStack_190 = local_198;
        fStack_18c = local_198;
        local_184 = local_198;
        fStack_174 = local_178;
        fStack_170 = local_178;
        fStack_16c = local_178;
        local_164 = local_178;
        fStack_154 = local_158;
        fStack_150 = local_158;
        fStack_14c = local_158;
        local_144 = local_158;
      }
      local_8 = local_1588;
      local_18 = local_16a8;
      uStack_10 = uStack_16a0;
      *(undefined8 *)local_1588 = local_16a8;
      *(undefined8 *)(local_1588 + 2) = uStack_16a0;
      local_20 = local_1588 + 4;
      local_38 = local_16b8;
      uStack_30 = uStack_16b0;
      *(undefined8 *)local_20 = local_16b8;
      *(undefined8 *)(local_1588 + 6) = uStack_16b0;
      local_40 = local_1588 + 8;
      local_58 = local_16c8;
      uStack_50 = uStack_16c0;
      *(undefined8 *)local_40 = local_16c8;
      *(undefined8 *)(local_1588 + 10) = uStack_16c0;
      local_60 = local_1588 + 0xc;
      local_78 = local_16d8;
      uStack_70 = uStack_16d0;
      *(undefined8 *)local_60 = local_16d8;
      *(undefined8 *)(local_1588 + 0xe) = uStack_16d0;
      local_1588 = local_1588 + 0x10;
    }
    for (; local_15f4 + 1 < local_1290; local_15f4 = local_15f4 + 2) {
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_1878);
      Mat::~Mat((Mat *)0x3332de);
      local_1830 = pfVar9;
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_18c8);
      Mat::~Mat((Mat *)0x333330);
      local_1238 = local_15f0;
      local_18d8 = *(undefined8 *)local_15f0;
      uStack_18d0 = *(undefined8 *)(local_15f0 + 2);
      local_1240 = local_15f0;
      local_18e8 = *(undefined8 *)local_15f0;
      uStack_18e0 = *(undefined8 *)(local_15f0 + 2);
      local_1880 = pfVar9;
      for (local_18ec = 0; local_18ec < local_127c; local_18ec = local_18ec + 1) {
        local_340 = local_1830;
        local_358 = *local_1830;
        local_1908 = CONCAT44(local_358,local_358);
        uStack_1900 = CONCAT44(local_358,local_358);
        local_360 = local_1830 + 1;
        local_378 = *local_360;
        local_1918 = CONCAT44(local_378,local_378);
        uStack_1910 = CONCAT44(local_378,local_378);
        local_380 = local_1830 + 2;
        local_398 = *local_380;
        local_1928 = CONCAT44(local_398,local_398);
        uStack_1920 = CONCAT44(local_398,local_398);
        local_3a0 = local_1830 + 3;
        local_3b8 = *local_3a0;
        local_1938 = CONCAT44(local_3b8,local_3b8);
        uStack_1930 = CONCAT44(local_3b8,local_3b8);
        local_3c0 = local_1830 + 4;
        local_3d8 = *local_3c0;
        local_1948 = CONCAT44(local_3d8,local_3d8);
        uStack_1940 = CONCAT44(local_3d8,local_3d8);
        local_3e0 = local_1830 + 5;
        local_3f8 = *local_3e0;
        local_1958 = CONCAT44(local_3f8,local_3f8);
        uStack_1950 = CONCAT44(local_3f8,local_3f8);
        local_400 = local_1830 + 6;
        local_418 = *local_400;
        local_1968 = CONCAT44(local_418,local_418);
        uStack_1960 = CONCAT44(local_418,local_418);
        local_420 = local_1830 + 7;
        local_438 = *local_420;
        local_1978 = CONCAT44(local_438,local_438);
        uStack_1970 = CONCAT44(local_438,local_438);
        local_100 = local_1880;
        local_1988 = *(undefined8 *)local_1880;
        uStack_1980 = *(undefined8 *)(local_1880 + 2);
        local_108 = local_1880 + 4;
        local_1998 = *(undefined8 *)local_108;
        uStack_1990 = *(undefined8 *)(local_1880 + 6);
        local_110 = local_1880 + 8;
        local_19a8 = *(undefined8 *)local_110;
        uStack_19a0 = *(undefined8 *)(local_1880 + 10);
        local_118 = local_1880 + 0xc;
        local_19b8 = *(undefined8 *)local_118;
        uStack_19b0 = *(undefined8 *)(local_1880 + 0xe);
        local_fc8 = local_18d8;
        uStack_fc0 = uStack_18d0;
        local_628._0_4_ = (float)local_1988;
        local_628._4_4_ = (float)((ulong)local_1988 >> 0x20);
        uStack_620._0_4_ = (float)uStack_1980;
        uStack_620._4_4_ = (float)((ulong)uStack_1980 >> 0x20);
        local_9a8 = (float)local_628 * local_358;
        fStack_9a4 = local_628._4_4_ * local_358;
        fStack_9a0 = (float)uStack_620 * local_358;
        fStack_99c = uStack_620._4_4_ * local_358;
        uVar1 = local_18d8;
        uVar2 = uStack_18d0;
        local_9b8._0_4_ = (float)local_18d8;
        local_9b8._4_4_ = (float)((ulong)local_18d8 >> 0x20);
        uStack_9b0._0_4_ = (float)uStack_18d0;
        uStack_9b0._4_4_ = (float)((ulong)uStack_18d0 >> 0x20);
        local_ff8 = CONCAT44(fStack_9a4 + local_9b8._4_4_,local_9a8 + (float)local_9b8);
        uStack_ff0 = CONCAT44(fStack_99c + uStack_9b0._4_4_,fStack_9a0 + (float)uStack_9b0);
        local_608._0_4_ = (float)local_1998;
        local_608._4_4_ = (float)((ulong)local_1998 >> 0x20);
        uStack_600._0_4_ = (float)uStack_1990;
        uStack_600._4_4_ = (float)((ulong)uStack_1990 >> 0x20);
        local_988 = (float)local_608 * local_378;
        fStack_984 = local_608._4_4_ * local_378;
        fStack_980 = (float)uStack_600 * local_378;
        fStack_97c = uStack_600._4_4_ * local_378;
        fVar10 = local_988 + local_9a8 + (float)local_9b8;
        fVar11 = fStack_984 + fStack_9a4 + local_9b8._4_4_;
        fVar12 = fStack_980 + fStack_9a0 + (float)uStack_9b0;
        fVar13 = fStack_97c + fStack_99c + uStack_9b0._4_4_;
        local_1028 = CONCAT44(fVar11,fVar10);
        uStack_1020 = CONCAT44(fVar13,fVar12);
        local_5e8._0_4_ = (float)local_19a8;
        local_5e8._4_4_ = (float)((ulong)local_19a8 >> 0x20);
        uStack_5e0._0_4_ = (float)uStack_19a0;
        uStack_5e0._4_4_ = (float)((ulong)uStack_19a0 >> 0x20);
        local_968 = (float)local_5e8 * local_398;
        fStack_964 = local_5e8._4_4_ * local_398;
        fStack_960 = (float)uStack_5e0 * local_398;
        fStack_95c = uStack_5e0._4_4_ * local_398;
        fVar10 = local_968 + fVar10;
        fVar11 = fStack_964 + fVar11;
        fVar12 = fStack_960 + fVar12;
        fVar13 = fStack_95c + fVar13;
        local_1058 = CONCAT44(fVar11,fVar10);
        uStack_1050 = CONCAT44(fVar13,fVar12);
        local_5c8._0_4_ = (float)local_19b8;
        local_5c8._4_4_ = (float)((ulong)local_19b8 >> 0x20);
        uStack_5c0._0_4_ = (float)uStack_19b0;
        uStack_5c0._4_4_ = (float)((ulong)uStack_19b0 >> 0x20);
        local_948 = (float)local_5c8 * local_3b8;
        fStack_944 = local_5c8._4_4_ * local_3b8;
        fStack_940 = (float)uStack_5c0 * local_3b8;
        fStack_93c = uStack_5c0._4_4_ * local_3b8;
        local_18d8 = CONCAT44(fStack_944 + fVar11,local_948 + fVar10);
        uStack_18d0 = CONCAT44(fStack_93c + fVar13,fStack_940 + fVar12);
        local_1088 = local_18e8;
        uStack_1080 = uStack_18e0;
        local_928 = (float)local_628 * local_3d8;
        fStack_924 = local_628._4_4_ * local_3d8;
        fStack_920 = (float)uStack_620 * local_3d8;
        fStack_91c = uStack_620._4_4_ * local_3d8;
        uVar3 = local_18e8;
        uVar4 = uStack_18e0;
        local_938._0_4_ = (float)local_18e8;
        local_938._4_4_ = (float)((ulong)local_18e8 >> 0x20);
        uStack_930._0_4_ = (float)uStack_18e0;
        uStack_930._4_4_ = (float)((ulong)uStack_18e0 >> 0x20);
        local_10b8 = CONCAT44(fStack_924 + local_938._4_4_,local_928 + (float)local_938);
        uStack_10b0 = CONCAT44(fStack_91c + uStack_930._4_4_,fStack_920 + (float)uStack_930);
        local_908 = (float)local_608 * local_3f8;
        fStack_904 = local_608._4_4_ * local_3f8;
        fStack_900 = (float)uStack_600 * local_3f8;
        fStack_8fc = uStack_600._4_4_ * local_3f8;
        fVar10 = local_908 + local_928 + (float)local_938;
        fVar11 = fStack_904 + fStack_924 + local_938._4_4_;
        fVar12 = fStack_900 + fStack_920 + (float)uStack_930;
        fVar13 = fStack_8fc + fStack_91c + uStack_930._4_4_;
        local_10e8 = CONCAT44(fVar11,fVar10);
        uStack_10e0 = CONCAT44(fVar13,fVar12);
        local_8e8 = (float)local_5e8 * local_418;
        fStack_8e4 = local_5e8._4_4_ * local_418;
        fStack_8e0 = (float)uStack_5e0 * local_418;
        fStack_8dc = uStack_5e0._4_4_ * local_418;
        fVar10 = local_8e8 + fVar10;
        fVar11 = fStack_8e4 + fVar11;
        fVar12 = fStack_8e0 + fVar12;
        fVar13 = fStack_8dc + fVar13;
        local_1118 = CONCAT44(fVar11,fVar10);
        uStack_1110 = CONCAT44(fVar13,fVar12);
        local_8c8._0_4_ = (float)local_5c8 * local_438;
        local_8c8._4_4_ = local_5c8._4_4_ * local_438;
        local_8c8._8_4_ = (float)uStack_5c0 * local_438;
        local_8c8._12_4_ = uStack_5c0._4_4_ * local_438;
        local_18e8 = CONCAT44(local_8c8._4_4_ + fVar11,local_8c8._0_4_ + fVar10);
        uStack_18e0 = CONCAT44(local_8c8._12_4_ + fVar13,local_8c8._8_4_ + fVar12);
        local_1830 = local_1830 + 8;
        local_1880 = local_1880 + 0x10;
        local_1108 = local_1978;
        uStack_1100 = uStack_1970;
        local_10f8 = local_19b8;
        uStack_10f0 = uStack_19b0;
        local_10d8 = local_1968;
        uStack_10d0 = uStack_1960;
        local_10c8 = local_19a8;
        uStack_10c0 = uStack_19a0;
        local_10a8 = local_1958;
        uStack_10a0 = uStack_1950;
        local_1098 = local_1998;
        uStack_1090 = uStack_1990;
        local_1078 = local_1948;
        uStack_1070 = uStack_1940;
        local_1068 = local_1988;
        uStack_1060 = uStack_1980;
        local_1048 = local_1938;
        uStack_1040 = uStack_1930;
        local_1038 = local_19b8;
        uStack_1030 = uStack_19b0;
        local_1018 = local_1928;
        uStack_1010 = uStack_1920;
        local_1008 = local_19a8;
        uStack_1000 = uStack_19a0;
        local_fe8 = local_1918;
        uStack_fe0 = uStack_1910;
        local_fd8 = local_1998;
        uStack_fd0 = uStack_1990;
        local_fb8 = local_1908;
        uStack_fb0 = uStack_1900;
        local_fa8 = local_1988;
        uStack_fa0 = uStack_1980;
        local_9b8 = uVar1;
        uStack_9b0 = uVar2;
        local_998 = local_ff8;
        uStack_990 = uStack_ff0;
        local_978 = local_1028;
        uStack_970 = uStack_1020;
        local_958 = local_1058;
        uStack_950 = uStack_1050;
        local_938 = uVar3;
        uStack_930 = uVar4;
        local_918 = local_10b8;
        uStack_910 = uStack_10b0;
        local_8f8 = local_10e8;
        uStack_8f0 = uStack_10e0;
        local_8d8 = local_1118;
        uStack_8d0 = uStack_1110;
        local_638 = local_1908;
        uStack_630 = uStack_1900;
        local_628 = local_1988;
        uStack_620 = uStack_1980;
        local_618 = local_1918;
        uStack_610 = uStack_1910;
        local_608 = local_1998;
        uStack_600 = uStack_1990;
        local_5f8 = local_1928;
        uStack_5f0 = uStack_1920;
        local_5e8 = local_19a8;
        uStack_5e0 = uStack_19a0;
        local_5d8 = local_1938;
        uStack_5d0 = uStack_1930;
        local_5c8 = local_19b8;
        uStack_5c0 = uStack_19b0;
        local_5b8 = local_1948;
        uStack_5b0 = uStack_1940;
        local_5a8 = local_1988;
        uStack_5a0 = uStack_1980;
        local_598 = local_1958;
        uStack_590 = uStack_1950;
        local_588 = local_1998;
        uStack_580 = uStack_1990;
        local_578 = local_1968;
        uStack_570 = uStack_1960;
        local_568 = local_19a8;
        uStack_560 = uStack_19a0;
        local_558 = local_1978;
        uStack_550 = uStack_1970;
        local_548 = local_19b8;
        uStack_540 = uStack_19b0;
        fStack_434 = local_438;
        fStack_430 = local_438;
        fStack_42c = local_438;
        local_424 = local_438;
        fStack_414 = local_418;
        fStack_410 = local_418;
        fStack_40c = local_418;
        local_404 = local_418;
        fStack_3f4 = local_3f8;
        fStack_3f0 = local_3f8;
        fStack_3ec = local_3f8;
        local_3e4 = local_3f8;
        fStack_3d4 = local_3d8;
        fStack_3d0 = local_3d8;
        fStack_3cc = local_3d8;
        local_3c4 = local_3d8;
        fStack_3b4 = local_3b8;
        fStack_3b0 = local_3b8;
        fStack_3ac = local_3b8;
        local_3a4 = local_3b8;
        fStack_394 = local_398;
        fStack_390 = local_398;
        fStack_38c = local_398;
        local_384 = local_398;
        fStack_374 = local_378;
        fStack_370 = local_378;
        fStack_36c = local_378;
        local_364 = local_378;
        fStack_354 = local_358;
        fStack_350 = local_358;
        fStack_34c = local_358;
        local_344 = local_358;
      }
      local_80 = local_1588;
      local_98 = local_18d8;
      uStack_90 = uStack_18d0;
      *(undefined8 *)local_1588 = local_18d8;
      *(undefined8 *)(local_1588 + 2) = uStack_18d0;
      local_a0 = local_1588 + 4;
      local_b8 = local_18e8;
      uStack_b0 = uStack_18e0;
      *(undefined8 *)local_a0 = local_18e8;
      *(undefined8 *)(local_1588 + 6) = uStack_18e0;
      local_1588 = local_1588 + 8;
    }
    for (; local_15f4 < local_1290; local_15f4 = local_15f4 + 1) {
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_1a08);
      Mat::~Mat((Mat *)0x333ede);
      local_19c0 = pfVar9;
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068),
                   (int)in_stack_ffffffffffffe064);
      pfVar9 = Mat::operator_cast_to_float_(&local_1a58);
      Mat::~Mat((Mat *)0x333f30);
      local_1248 = local_15f0;
      local_1a68 = *(undefined8 *)local_15f0;
      uStack_1a60 = *(undefined8 *)(local_15f0 + 2);
      local_1a10 = pfVar9;
      for (local_1a6c = 0; local_1a6c < local_127c; local_1a6c = local_1a6c + 1) {
        local_440 = local_19c0;
        local_458 = *local_19c0;
        local_1138 = CONCAT44(local_458,local_458);
        uStack_1130 = CONCAT44(local_458,local_458);
        local_460 = local_19c0 + 1;
        local_478 = *local_460;
        local_1168 = CONCAT44(local_478,local_478);
        uStack_1160 = CONCAT44(local_478,local_478);
        local_480 = local_19c0 + 2;
        local_498 = *local_480;
        local_1198 = CONCAT44(local_498,local_498);
        uStack_1190 = CONCAT44(local_498,local_498);
        local_4a0 = local_19c0 + 3;
        local_4b8 = *local_4a0;
        local_11c8 = CONCAT44(local_4b8,local_4b8);
        uStack_11c0 = CONCAT44(local_4b8,local_4b8);
        local_120 = local_1a10;
        local_1128 = *(undefined8 *)local_1a10;
        uStack_1120 = *(undefined8 *)(local_1a10 + 2);
        local_128 = local_1a10 + 4;
        local_1158 = *(undefined8 *)local_128;
        uStack_1150 = *(undefined8 *)(local_1a10 + 6);
        local_130 = local_1a10 + 8;
        local_1188 = *(undefined8 *)local_130;
        uStack_1180 = *(undefined8 *)(local_1a10 + 10);
        local_138 = local_1a10 + 0xc;
        local_11b8 = *(undefined8 *)local_138;
        uStack_11b0 = *(undefined8 *)(local_1a10 + 0xe);
        local_1148 = local_1a68;
        uStack_1140 = uStack_1a60;
        local_528._0_4_ = (float)local_1128;
        local_528._4_4_ = (float)((ulong)local_1128 >> 0x20);
        uStack_520._0_4_ = (float)uStack_1120;
        uStack_520._4_4_ = (float)((ulong)uStack_1120 >> 0x20);
        local_8a8 = (float)local_528 * local_458;
        fStack_8a4 = local_528._4_4_ * local_458;
        fStack_8a0 = (float)uStack_520 * local_458;
        fStack_89c = uStack_520._4_4_ * local_458;
        uVar1 = local_1a68;
        uVar2 = uStack_1a60;
        local_8b8._0_4_ = (float)local_1a68;
        local_8b8._4_4_ = (float)((ulong)local_1a68 >> 0x20);
        uStack_8b0._0_4_ = (float)uStack_1a60;
        uStack_8b0._4_4_ = (float)((ulong)uStack_1a60 >> 0x20);
        local_1178 = CONCAT44(fStack_8a4 + local_8b8._4_4_,local_8a8 + (float)local_8b8);
        uStack_1170 = CONCAT44(fStack_89c + uStack_8b0._4_4_,fStack_8a0 + (float)uStack_8b0);
        local_508._0_4_ = (float)local_1158;
        local_508._4_4_ = (float)((ulong)local_1158 >> 0x20);
        uStack_500._0_4_ = (float)uStack_1150;
        uStack_500._4_4_ = (float)((ulong)uStack_1150 >> 0x20);
        local_888 = (float)local_508 * local_478;
        fStack_884 = local_508._4_4_ * local_478;
        fStack_880 = (float)uStack_500 * local_478;
        fStack_87c = uStack_500._4_4_ * local_478;
        in_stack_ffffffffffffe068 = local_888 + local_8a8 + (float)local_8b8;
        in_stack_ffffffffffffe06c = fStack_884 + fStack_8a4 + local_8b8._4_4_;
        fVar10 = fStack_880 + fStack_8a0 + (float)uStack_8b0;
        in_stack_ffffffffffffe064 = fStack_87c + fStack_89c + uStack_8b0._4_4_;
        local_11a8 = CONCAT44(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068);
        uStack_11a0 = CONCAT44(in_stack_ffffffffffffe064,fVar10);
        local_4e8._0_4_ = (float)local_1188;
        local_4e8._4_4_ = (float)((ulong)local_1188 >> 0x20);
        uStack_4e0._0_4_ = (float)uStack_1180;
        uStack_4e0._4_4_ = (float)((ulong)uStack_1180 >> 0x20);
        local_868 = (float)local_4e8 * local_498;
        fStack_864 = local_4e8._4_4_ * local_498;
        fStack_860 = (float)uStack_4e0 * local_498;
        fStack_85c = uStack_4e0._4_4_ * local_498;
        fVar10 = fStack_860 + fVar10;
        in_stack_ffffffffffffe064 = fStack_85c + in_stack_ffffffffffffe064;
        local_11d8 = CONCAT44(fStack_864 + in_stack_ffffffffffffe06c,
                              local_868 + in_stack_ffffffffffffe068);
        uStack_11d0 = CONCAT44(in_stack_ffffffffffffe064,fVar10);
        local_4c8._0_4_ = (float)local_11b8;
        local_4c8._4_4_ = (float)((ulong)local_11b8 >> 0x20);
        uStack_4c0._0_4_ = (float)uStack_11b0;
        uStack_4c0._4_4_ = (float)((ulong)uStack_11b0 >> 0x20);
        local_848._0_4_ = (float)local_4c8 * local_4b8;
        local_848._4_4_ = local_4c8._4_4_ * local_4b8;
        local_848._8_4_ = (float)uStack_4c0 * local_4b8;
        local_848._12_4_ = uStack_4c0._4_4_ * local_4b8;
        local_1a68 = CONCAT44(local_848._4_4_ + fStack_864 + in_stack_ffffffffffffe06c,
                              local_848._0_4_ + local_868 + in_stack_ffffffffffffe068);
        uStack_1a60 = CONCAT44(local_848._12_4_ + in_stack_ffffffffffffe064,local_848._8_4_ + fVar10
                              );
        local_19c0 = local_19c0 + 4;
        local_1a10 = local_1a10 + 0x10;
        local_8b8 = uVar1;
        uStack_8b0 = uVar2;
        local_898 = local_1178;
        uStack_890 = uStack_1170;
        local_878 = local_11a8;
        uStack_870 = uStack_11a0;
        local_858 = local_11d8;
        uStack_850 = uStack_11d0;
        local_538 = local_1138;
        uStack_530 = uStack_1130;
        local_528 = local_1128;
        uStack_520 = uStack_1120;
        local_518 = local_1168;
        uStack_510 = uStack_1160;
        local_508 = local_1158;
        uStack_500 = uStack_1150;
        local_4f8 = local_1198;
        uStack_4f0 = uStack_1190;
        local_4e8 = local_1188;
        uStack_4e0 = uStack_1180;
        local_4d8 = local_11c8;
        uStack_4d0 = uStack_11c0;
        local_4c8 = local_11b8;
        uStack_4c0 = uStack_11b0;
        fStack_4b4 = local_4b8;
        fStack_4b0 = local_4b8;
        fStack_4ac = local_4b8;
        local_4a4 = local_4b8;
        fStack_494 = local_498;
        fStack_490 = local_498;
        fStack_48c = local_498;
        local_484 = local_498;
        fStack_474 = local_478;
        fStack_470 = local_478;
        fStack_46c = local_478;
        local_464 = local_478;
        fStack_454 = local_458;
        fStack_450 = local_458;
        fStack_44c = local_458;
        local_444 = local_458;
      }
      local_c0 = local_1588;
      local_d8 = local_1a68;
      uStack_d0 = uStack_1a60;
      *(undefined8 *)local_1588 = local_1a68;
      *(undefined8 *)(local_1588 + 2) = uStack_1a60;
      local_1588 = local_1588 + 4;
    }
  }
  Mat::~Mat((Mat *)0x33459e);
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    int outch = top_blob.c;

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int size = w * h;

    const float* bias = _bias;

    // interleave
    Mat tmp(4, inch, size / 4 + (size % 4) / 2 + size % 2, elemsize, elempack, opt.workspace_allocator);
    {
        int nn_size;
        int remain_size_start;

        remain_size_start = 0;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                __m128 _r2 = _mm_loadu_ps(img0 + 8);
                __m128 _r3 = _mm_loadu_ps(img0 + 12);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);
                _mm_storeu_ps(tmpptr + 8, _r2);
                _mm_storeu_ps(tmpptr + 12, _r3);

                tmpptr += 16;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);

                tmpptr += 8;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                _mm_storeu_ps(tmpptr, _r0);

                tmpptr += 4;
                img0 += bottom_blob.cstep * 4;
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 4);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);
            __m128 _sum2 = _mm_loadu_ps(biasptr);
            __m128 _sum3 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);
                __m128 _val20 = _mm_load1_ps(tmpptr + 8);
                __m128 _val21 = _mm_load1_ps(tmpptr + 9);
                __m128 _val22 = _mm_load1_ps(tmpptr + 10);
                __m128 _val23 = _mm_load1_ps(tmpptr + 11);
                __m128 _val30 = _mm_load1_ps(tmpptr + 12);
                __m128 _val31 = _mm_load1_ps(tmpptr + 13);
                __m128 _val32 = _mm_load1_ps(tmpptr + 14);
                __m128 _val33 = _mm_load1_ps(tmpptr + 15);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val20, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w1, _val21, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w2, _val22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w3, _val23, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_w0, _val30, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w1, _val31, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w2, _val32, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w3, _val33, _sum3);

                tmpptr += 16;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i + 1 < size; i += 2)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum = _mm_comp_fmadd_ps(_w0, _val0, _sum);
                _sum = _mm_comp_fmadd_ps(_w1, _val1, _sum);
                _sum = _mm_comp_fmadd_ps(_w2, _val2, _sum);
                _sum = _mm_comp_fmadd_ps(_w3, _val3, _sum);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }

    //     // NOTE sgemm
    //     for (; p<outch; p++)
    //     {
    //         Mat out0 = top_blob.channel(p);
    //
    //         const float bias0 = bias ? bias[p] : 0.f;
    //
    //         float* outptr0 = out0;
    //
    //         for (int i=0; i<size; i++)
    //         {
    //             float sum = bias0;
    //
    //             const float* kptr = _kernel.channel(p);
    //
    //             for (int q=0; q<inch; q++)
    //             {
    //                 const float* img0 = bottom_blob.channel(q);
    //
    //                 sum += img0[i] * kptr[0];
    //                 kptr ++;
    //             }
    //
    //             outptr0[i] = sum;
    //         }
    //     }
}